

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create.cpp
# Opt level: O0

bool __thiscall create::Create::isLeftWheeldrop(Create *this)

{
  bool bVar1;
  uint16_t uVar2;
  element_type *peVar3;
  element_type *this_00;
  ostream *poVar4;
  Create *local_18;
  Create *this_local;
  
  local_18 = this;
  peVar3 = std::__shared_ptr_access<create::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<create::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )&this->data);
  bVar1 = Data::isValidPacketID(peVar3,'\a');
  if (bVar1) {
    peVar3 = std::__shared_ptr_access<create::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<create::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->data);
    Data::getPacket((Data *)&stack0xffffffffffffffd8,(uint8_t)peVar3);
    this_00 = std::__shared_ptr_access<create::Packet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<create::Packet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&stack0xffffffffffffffd8);
    uVar2 = Packet::getData(this_00);
    this_local._7_1_ = (uVar2 & 8) != 0;
    std::shared_ptr<create::Packet>::~shared_ptr
              ((shared_ptr<create::Packet> *)&stack0xffffffffffffffd8);
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cerr,"[create::Create] ");
    poVar4 = std::operator<<(poVar4,"Wheeldrop sensor not supported!");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Create::isLeftWheeldrop() const {
    if (data->isValidPacketID(ID_BUMP_WHEELDROP)) {
      return (GET_DATA(ID_BUMP_WHEELDROP) & 0x08) != 0;
    }
    else {
      CERR("[create::Create] ", "Wheeldrop sensor not supported!");
      return false;
    }
  }